

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadBoundThreadContextManager.cpp
# Opt level: O2

void ThreadBoundThreadContextManager::DestroyContextAndEntryForCurrentThread(void)

{
  ThreadContext *threadContext;
  ThreadContextTLSEntry *local_20;
  ThreadContextTLSEntry *entry;
  AutoCriticalSection lock;
  
  entry = (ThreadContextTLSEntry *)&ThreadContext::s_csThreadContext;
  CCLock::Enter(&ThreadContext::s_csThreadContext.super_CCLock);
  local_20 = ThreadContextTLSEntry::GetEntryForCurrentThread();
  if (local_20 != (ThreadContextTLSEntry *)0x0) {
    threadContext = ThreadContextTLSEntry::GetThreadContext(local_20);
    DList<ThreadContextTLSEntry_*,_Memory::HeapAllocator,_RealCount>::Remove(&entries,&local_20);
    if ((threadContext != (ThreadContext *)0x0) && (threadContext->isThreadBound == true)) {
      ThreadContextManagerBase::ShutdownThreadContext(threadContext,true);
    }
    ThreadContextTLSEntry::CleanupThread();
  }
  AutoCriticalSection::~AutoCriticalSection((AutoCriticalSection *)&entry);
  return;
}

Assistant:

void ThreadBoundThreadContextManager::DestroyContextAndEntryForCurrentThread()
{
    AutoCriticalSection lock(ThreadContext::GetCriticalSection());

    ThreadContextTLSEntry * entry = ThreadContextTLSEntry::GetEntryForCurrentThread();

    if (entry == NULL)
    {
        return;
    }

    ThreadContext * threadContext = static_cast<ThreadContext *>(entry->GetThreadContext());
    entries.Remove(entry);

    if (threadContext != NULL && threadContext->IsThreadBound())
    {
        ShutdownThreadContext(threadContext);
    }

    ThreadContextTLSEntry::CleanupThread();
}